

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O3

void __thiscall MPLSStreamInfo::MPLSStreamInfo(MPLSStreamInfo *this,PMTStreamInfo *pmtStreamInfo)

{
  AbstractStreamReader *pAVar1;
  int iVar2;
  PipCorner PVar3;
  uint uVar4;
  uint uVar5;
  
  M2TSStreamInfo::M2TSStreamInfo(&this->super_M2TSStreamInfo,pmtStreamInfo);
  this->type = '\x01';
  this->offsetId = 0xff;
  this->isSSPG = false;
  this->SS_PG_offset_sequence_id = 0xff;
  this->leftEye = (MPLSStreamInfo *)0x0;
  this->rightEye = (MPLSStreamInfo *)0x0;
  (this->pipParams).scaleIndex = 1;
  (this->pipParams).corner = TopLeft;
  (this->pipParams).hOffset = 0;
  (this->pipParams).vOffset = 0;
  (this->pipParams).lumma = 3;
  pAVar1 = pmtStreamInfo->m_codecReader;
  iVar2 = (pAVar1->m_pipParams).scaleIndex;
  PVar3 = (pAVar1->m_pipParams).corner;
  uVar4 = (pAVar1->m_pipParams).hOffset;
  uVar5 = (pAVar1->m_pipParams).vOffset;
  (this->pipParams).lumma = (pAVar1->m_pipParams).lumma;
  (this->pipParams).scaleIndex = iVar2;
  (this->pipParams).corner = PVar3;
  (this->pipParams).hOffset = uVar4;
  (this->pipParams).vOffset = uVar5;
  return;
}

Assistant:

MPLSStreamInfo::MPLSStreamInfo(const PMTStreamInfo& pmtStreamInfo)
    : M2TSStreamInfo(pmtStreamInfo),
      type(1),
      offsetId(0xff),
      isSSPG(false),
      SS_PG_offset_sequence_id(0xff),
      leftEye(nullptr),
      rightEye(nullptr)
{
    pipParams = pmtStreamInfo.m_codecReader->getPipParams();
}